

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ExprNodeFirst(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5IndexIter **ppFVar1;
  Fts5ExprNearset *pFVar2;
  Fts5ExprPhrase *pFVar3;
  Fts5Index *p;
  char *__s;
  Fts5ExprNode *pNode_00;
  Fts5IndexIter *pFVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Fts5ExprTerm *pFVar12;
  long lVar13;
  long lVar14;
  
  pNode->bEof = 0;
  pNode->bNomatch = 0;
  iVar6 = pNode->eType;
  if ((iVar6 == 9) || (iVar6 == 4)) {
    pFVar2 = pNode->pNear;
    iVar6 = pFVar2->nPhrase;
    if (0 < iVar6) {
      lVar14 = 0;
      do {
        iVar9 = 1;
        pFVar3 = pFVar2->apPhrase[lVar14];
        if (pFVar3->nTerm == 0) goto LAB_001c9f3f;
        if (0 < pFVar3->nTerm) {
          lVar13 = 0;
          do {
            bVar5 = false;
            pFVar12 = pFVar3->aTerm + lVar13;
            do {
              if (pFVar12->pIter != (Fts5IndexIter *)0x0) {
                sqlite3Fts5IterClose(pFVar12->pIter);
                pFVar12->pIter = (Fts5IndexIter *)0x0;
              }
              p = pExpr->pIndex;
              __s = pFVar12->zTerm;
              sVar8 = strlen(__s);
              iVar6 = sqlite3Fts5IndexQuery
                                (p,__s,(int)sVar8,
                                 (uint)(pFVar3->aTerm[lVar13].bPrefix != '\0') +
                                 (uint)(pExpr->bDesc != 0) * 2,pFVar2->pColset,&pFVar12->pIter);
              if (iVar6 != 0) {
                return iVar6;
              }
              ppFVar1 = &pFVar12->pIter;
              pFVar12 = pFVar12->pSynonym;
              iVar9 = 1;
              if ((*ppFVar1)->bEof == '\0') {
                bVar5 = true;
              }
            } while (pFVar12 != (Fts5ExprTerm *)0x0);
            if (!bVar5) goto LAB_001c9f3f;
            lVar13 = lVar13 + 1;
          } while (lVar13 < pFVar3->nTerm);
          iVar6 = pFVar2->nPhrase;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar6);
    }
    iVar9 = 0;
LAB_001c9f3f:
    pNode->bEof = iVar9;
    goto LAB_001c9fe7;
  }
  if (pNode->xNext == (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0) {
    pNode->bEof = 1;
    return 0;
  }
  iVar9 = pNode->nChild;
  iVar10 = 0;
  iVar11 = 0;
  if (iVar9 < 1) {
    iVar7 = 0;
  }
  else {
    lVar14 = 6;
    do {
      pNode_00 = pNode->apChild[lVar14 + -6];
      iVar7 = fts5ExprNodeFirst(pExpr,pNode_00);
      iVar10 = iVar10 + pNode_00->bEof;
      iVar9 = pNode->nChild;
      if ((long)iVar9 <= lVar14 + -5) break;
      lVar14 = lVar14 + 1;
    } while (iVar7 == 0);
    iVar6 = pNode->eType;
    iVar11 = iVar10;
  }
  pNode->iRowid = pNode->apChild[0]->iRowid;
  if (iVar6 == 1) {
    if (iVar9 == iVar11) {
LAB_001c9fcc:
      fts5ExprSetEof(pNode);
    }
  }
  else if (iVar6 == 2) {
    if (0 < iVar11) goto LAB_001c9fcc;
  }
  else {
    pNode->bEof = pNode->apChild[0]->bEof;
  }
  if (iVar7 != 0) {
    return iVar7;
  }
  iVar9 = pNode->bEof;
LAB_001c9fe7:
  if (iVar9 == 0) {
    switch(pNode->eType) {
    case 1:
      fts5ExprNodeTest_OR(pExpr,pNode);
      break;
    case 2:
      iVar6 = fts5ExprNodeTest_AND(pExpr,pNode);
      return iVar6;
    default:
      iVar6 = fts5ExprNodeTest_NOT(pExpr,pNode);
      return iVar6;
    case 4:
      pFVar3 = pNode->pNear->apPhrase[0];
      pFVar4 = pFVar3->aTerm[0].pIter;
      iVar6 = pFVar4->nData;
      iVar9 = pExpr->pConfig->eDetail;
      (pFVar3->poslist).n = iVar6;
      if (iVar9 == 0) {
        (pFVar3->poslist).p = pFVar4->pData;
      }
      pNode->iRowid = pFVar4->iRowid;
      pNode->bNomatch = (uint)(iVar6 == 0);
      break;
    case 9:
      iVar6 = fts5ExprNodeTest_STRING(pExpr,pNode);
      return iVar6;
    }
  }
  return 0;
}

Assistant:

static int fts5ExprNodeFirst(Fts5Expr *pExpr, Fts5ExprNode *pNode){
  int rc = SQLITE_OK;
  pNode->bEof = 0;
  pNode->bNomatch = 0;

  if( Fts5NodeIsString(pNode) ){
    /* Initialize all term iterators in the NEAR object. */
    rc = fts5ExprNearInitAll(pExpr, pNode);
  }else if( pNode->xNext==0 ){
    pNode->bEof = 1;
  }else{
    int i;
    int nEof = 0;
    for(i=0; i<pNode->nChild && rc==SQLITE_OK; i++){
      Fts5ExprNode *pChild = pNode->apChild[i];
      rc = fts5ExprNodeFirst(pExpr, pNode->apChild[i]);
      assert( pChild->bEof==0 || pChild->bEof==1 );
      nEof += pChild->bEof;
    }
    pNode->iRowid = pNode->apChild[0]->iRowid;

    switch( pNode->eType ){
      case FTS5_AND:
        if( nEof>0 ) fts5ExprSetEof(pNode);
        break;

      case FTS5_OR:
        if( pNode->nChild==nEof ) fts5ExprSetEof(pNode);
        break;

      default:
        assert( pNode->eType==FTS5_NOT );
        pNode->bEof = pNode->apChild[0]->bEof;
        break;
    }
  }

  if( rc==SQLITE_OK ){
    rc = fts5ExprNodeTest(pExpr, pNode);
  }
  return rc;
}